

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::~Forth(Forth *this)

{
  Forth *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->inputBufferStrings);
  std::
  map<unsigned_int,_void_(*)(cppforth::Forth_*),_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_void_(*)(cppforth::Forth_*)>_>_>
  ::~map(&this->cfunctions);
  std::
  vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
  ::~vector(&this->VirtualMemory);
  std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::~vector
            (&this->OpenFiles);
  ForthStack<unsigned_int>::~ForthStack(&this->catchStack);
  std::vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
  ::~vector(&this->savedInputVector);
  std::vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
  ::~vector(&this->savedInput);
  std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
  ~vector(&this->localVariables);
  std::
  map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
  ::~map(&this->blocksInProcess);
  std::__cxx11::string::~string((string *)&this->blockFileName);
  std::vector<int,_std::allocator<int>_>::~vector(&this->searchOrder);
  ForthStack<unsigned_int>::~ForthStack(&this->returnStack);
  ForthStack<double>::~ForthStack(&this->fStack);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->replacesSubstitute);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->picturedInputBuffer);
  std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::~vector
            (&this->definitions);
  ForthStack<unsigned_int>::~ForthStack(&this->controlStackIf_Begin);
  ForthStack<unsigned_int>::~ForthStack(&this->controlStackLoops);
  ForthStack<unsigned_int>::~ForthStack(&this->rStack);
  ForthStack<unsigned_int>::~ForthStack(&this->dStack);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->std_cin);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->std_cerr);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->std_cout);
  return;
}

Assistant:

class Forth {
		/****

		----

		Data Types
		----------

		Next I define some types.

		A `Cell` is the basic Forth type.  I define the `Cell` type using the C++
		`uintptr_t` type to ensure it is large enough to hold an address.  This
		generally means that it will be a 32-bit value on 32-bit platforms and a 64-bit
		value on 64-bit platforms.  (If you want to build a 32-bit Forth on a 64-bit
		platform with clang or gcc, you can pass the `-m32` flag to the compiler and
		linker.)

		Forth doesn't require type declarations; a cell can be used as an address, an
		unsigned integer, a signed integer, or a variety of other uses.  However, in
		C++ we will have to be explicit about types to perform the operations we want
		to perform.  So I define a few additional types to represent the ways that a
		`Cell` can be used, and a few macros to cast between types without littering
		the code with a lot of `reinterpret_cast<...>(...)` expressions.

		****/

	public:
		typedef unsigned int Cell;      // unsigned value
		typedef signed int  SCell;     // signed value
	private:
		class DCell {
		public:
			union {
				struct {
					Cell lo, hi;
				} Cells;
				struct {
					SCell lo, hi;
				} SCells;
				unsigned long long int Dcells;
				signed long long int SDcells;
			} data_;
			DCell()  { data_.Cells.lo = 0; data_.Cells.hi = 0; };
			DCell(Cell valueLo,Cell valueHi) { data_.Cells.lo = valueLo; data_.Cells.hi = valueHi; };
			DCell(DCell &value)  {
				data_.Cells.lo = value.data_.Cells.lo; data_.Cells.hi = value.data_.Cells.hi;
			};
			DCell(unsigned long long int value)  {
				data_.Dcells = value;
			}
		};
		class SDCell {
		public:
			union {
				struct {
					SCell lo, hi;
				} Cells;
				 long long int Dcells;
			} data_;
			SDCell()  { data_.Cells.lo = 0; data_.Cells.hi = 0; };
			SDCell(SCell valueLo, SCell valueHi) { data_.Cells.lo = valueLo; data_.Cells.hi = valueHi; };
			SDCell(SDCell &value)  {
				data_.Cells.lo = value.data_.Cells.lo; data_.Cells.hi = value.data_.Cells.hi;
			};
			SDCell(long long int value)  {
				data_.Dcells = value;
			}
		};
		typedef unsigned char Char;
		typedef signed char SChar;

		typedef Cell CAddr;          // Any address
		typedef Cell AAddr;          // Cell-aligned address

#define CELL(x)    static_cast<Cell>(x)
#define CADDR(x)   static_cast<CAddr>(x)
#define AADDR(x)   static_cast<AAddr>(x)
#define CHARPTR(x) reinterpret_cast<char*>(x)
#define SIZE_T(x)  static_cast<std::size_t>(x)

		const Cell CellSize = sizeof(Cell);
		const Cell DCellSize = sizeof(DCell);

		/****

		Boolean Constants
		-----------------

		Here I define constants for Forth _true_ and _false_ Boolean flag values.

		Note that the Forth convention is that a true flag is a cell with all bits set,
		unlike the C++ convention of using 1 or any other non-zero value to mean true,
		so we need to be sure to use these constants for all Forth words that return a
		Boolean flag.

		****/

		const Cell False = 0;
		const Cell True = ~False;
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
		std::stringstream std_cout{},  std_cerr{};
#endif
		std::stringstream  std_cin{};
		/****

		Configuration Constants
		-----------------------

		I have a few macros to define the size of the Forth data space, the maximum
		numbers of cells on the data and return stacks
		****/

		const size_t FORTHSCRIPTCPP_DATASPACE_SIZE = (1 * 1024 * 1024 * sizeof(Cell));
		const size_t FORTHSCRIPTCPP_DSTACK_COUNT = 1556;
		const size_t FORTHSCRIPTCPP_RSTACK_COUNT = 1556;

		/****

		----

		The Definition Struct
		---------------------

		My first big departure from traditional Forth implementations is how I will
		store the word definitions for the Forth dictionary.  Traditional Forths
		intersperse the word names in the shared data space along with code and data,
		using a linked list to navigate through them.  I am going to use a `std::vector`
		of `Definition` structs, outside of the data space.

		Use of `std::vector` has these benefits:

		- The `Definition` structures won't use data space.  The C++ library will take care of allocating heap space as needed.

		One of the members of `Definition` is a C++ `std::string` to hold the name.  I
		won't need to worry about managing the memory for that variable-length field.
		The `name` field will be empty for a `:NONAME` definition.

		A `Definition` also has a `code` field that points to the native code
		associated with the word, a `does` field pointing to associated Forth
		instructions, a `parameter` field that points to associated data-space
		elements, and some bit flags to keep track of whether the word is `IMMEDIATE`
		and/or `HIDDEN`.  We will explore the use of these fields later when I talk
		about the inner and outer interpreters.

		`Definition` has a static field `executingWord` that contains the address
		of the `Definition` that was most recently executed.  This can be used by
		`Code` functions to refer to their definitions.

		Finally, `Definition` has a few member functions for executing the code and for
		accessing the _hidden_ and _immediate_ flags.

		****/

		typedef void(Forth::*Code)(void);

		struct Definition {
			Code   code;
			Cell   does;
			AAddr  parameter;
			Cell   flags;
			std::string name;
			Cell numberInVector;
			SCell searchOrder;
			const Cell FlagHidden = (1 << 1);
			const  Cell FlagImmediate = (1 << 2);
			Definition() : code{ nullptr }, does{ 0 }, parameter{ 0 }, flags{ 0 },
				name{}, numberInVector{},searchOrder{}
			{
			}

			bool isHidden() const    { return (flags & FlagHidden) != 0; }

			void toggleHidden()      { flags ^= FlagHidden; }

			bool isImmediate() const { 
				return (flags & FlagImmediate) != 0;
			}

			void toggleImmediate()   { 
				flags |= FlagImmediate;  
			}

			bool isFindable() const { return name.size()>0 && !isHidden(); }
		};

			void executeDefinition(struct Definition definition) {
				auto saved = executingWord;
				executingWord = definition.numberInVector;
				if (definition.code) {
					if (isTraceCalls()) {
						
						std::cout << definition.name << " ";
						// int i = forth_depth();
						// std::cerr << definition.name << " " << forth_depth();
						// while (i > 0) std::cerr << " " << forth_tocell(i--  - 1);
						// std::cerr<< std::endl;
					}
					((*this).*(definition.code))();
				}
				else {
					throw AbortException("Word \""+definition.name+"\" has nullptr code");
				}
				executingWord = saved;
			}

		/****

		I will use the index of the `Definition` in std::vestor as the Forth _execution token_ (XT).

		****/

		typedef Cell Xt;
#define XT(x) static_cast<Xt>(x)

		/****

		I have to define the `executingWord` member used in `Definition`.

		****/
	private:
		Xt executingWord = 0;

		// Split std::string by delimiters in tokens
		void split_str(const std::string& str, std::vector<std::string>& tokens, const std::string& delimiters)
		{
			std::string::size_type delimitersSize = delimiters.size();
			std::string::size_type pos = str.find(delimiters, 0);
			std::string::size_type lastPos = str.find(delimiters, pos + delimitersSize);
			tokens.push_back(str.substr(0, pos));

			while (str.find_first_not_of(delimiters, pos) != std::wstring::npos)
			{
				tokens.push_back(str.substr(pos + delimitersSize, lastPos - pos - delimitersSize));
				pos = str.find(delimiters, lastPos);
				lastPos = str.find(delimiters, pos + delimitersSize);
			}
		}

		/****

		----

		Global Variables
		----------------

		With the types defined, next I define global variables, starting with the Forth
		data space and the data and return stacks.

		Each of these arrays is implemented as std::vector<Cell>, 
		so I can easily test with size() method whether I need to report an overflow.

		****/

		template <typename CellType> class ForthStack {
			std::vector<CellType> stack;
			Cell top;
		public:
			ForthStack() :  stack{}, top{ 0 } {
				stack.resize(256); 
			};
			void resize(size_t newsize){
				stack.resize(newsize);
			};
			CellType getTop(){
				if ( (top) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				return stack.at(top);
			}
			// returns *(top-index)
			CellType getTop(size_t index){
				{auto index1 = top - index;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				return stack.at(top - index);
			}
			void setTop(CellType Value){
				{auto index1 = top ;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				stack.at(top) = Value;
			}
			// sets *(top-index) = Value
			void setTop(size_t index, CellType Value){

				{auto index1 = top - index;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				stack.at(top - index) = Value;
			}
			void moveStack(size_t to, size_t from, size_t count){
				auto stackSize = stack.size();
				if (count >= 0 && (top - to) >= 0 && (top - to) < stackSize &&
					(top - to + count) < stackSize &&
					(top - from) >= 0 && (top - from) < stackSize &&
					(top - from + count) < stackSize
					){
					std::memmove(&stack[top - to], &stack[top - from], count * sizeof(CellType));
				}
				else {
					throw AbortException(std::string("access of data stack outside of borders"));
				}
			}
			bool availableStack(size_t n) {
				return	(top + n) < stack.size();
			}
			void push(CellType x) {
				{auto index1 = top + 1;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				stack.at(++top) = x;
			}
			void pop() {
				if (top == 0){
					throw AbortException("Forth stack underflow");
				}
				--top;
			}
			void resetStack() {
				top = 0;
				std::memset(&stack[0], 0, stack.size()*sizeof(stack[0]));

			}
			// Return the depth of the data stack.
			Cell stackDepth() {
				return top ;
			}
			// return stack content as std::vector for debug and trace 
			std::vector<CellType> debugStack(){
				std::vector<CellType> stackForReturn = stack;
				stackForReturn.resize(top + 1);
				return stackForReturn;
			}
		};
		// Data stack
		ForthStack<Cell> dStack{}; 
		// Return stack R> >R
		ForthStack<Cell> rStack{};
		// control stack for DO LOOP
		ForthStack<Cell> controlStackLoops{};
		// control stack for IF ELSE THEN Begin While Repeat Until Again
		ForthStack<Cell> controlStackIf_Begin{};

		//std::vector<Char> dataSpace{};
	
		/****

		The Forth dictionary is a vector of `Definition`s.  The most recent definition is
		at the back of the list.

		****/

		std::vector<Definition> definitions{};

		Definition *getDefinition(Cell index){
			if ((index < 0) || (index >= definitions.size())){
					throwCppExceptionMessage("Access to definitions out of range "+std::to_string(index),errorUndefinedWord);
			}
			return &definitions[index];
		}

		/****

		For each of the global arrays, I need a pointer to the current location.

		For the data space, we have the `getDataPointer`, which corresponds to Forth's
		`HERE`.

		For each of the stacks, we need a pointer to the element at the top of the
		stack.  The stacks grow upward.  When a stack is empty, the associated pointer
		points to an address below the actual bottom of the array, so we will need to
		avoid dereferencing these pointers under those circumstances.

		****/

		
			void setIsCompiling(Cell value){
				setDataCell(getIsCompilingAddress(), value);
			}

			Cell getIsCompiling() { 
				auto value=getDataCell(getIsCompilingAddress());
			    return value;
			}

			CAddr getIsCompilingAddress()  { return VarOffsetState; }

		CAddr dataPointer = 0;
		CAddr getDataPointer(){
			return dataPointer;
		}
		void setDataPointer(CAddr value){
			dataPointer = value;
		}
		void incDataPointer(SCell value){
			setDataPointer(getDataPointer() + value);
		}
		const CAddr VarOffsetState = CellSize*1;
		const CAddr VarOffsetSourceAddress = CellSize * 2;  // SOURCE variable
		const CAddr VarOffsetSourceSize = CellSize * 3;		// SOURCE buffer size
		const CAddr VarOffsetSourceOffset = CellSize * 4;   // >IN variable
		const CAddr VarOffsetBlkAddress = CellSize * 5;		// BLK variable
		const CAddr VarOffsetNumericBase = CellSize * 6;	// BASE variable
		const CAddr VarOffsetScrAddress = CellSize * 7;		// SCR variable
		const CAddr VarOffsetWordBuffer = CellSize * 8;
		const CAddr WordBufferSize = CellSize * 256;
		const CAddr VarOffsetPadBuffer = VarOffsetWordBuffer+WordBufferSize;
		const CAddr PadBufferSize = 256;
		const CAddr VarOffsetDebugBuffer = VarOffsetPadBuffer+PadBufferSize;
		const CAddr DebugBufferSize = CellSize * 256;
		// remove const CAddr VarOffsetSourceBuffer = VarOffsetDebugBuffer+DebugBufferSize;
		
		Definition &definitionsAt(Cell index){
			if (index >= definitions.size() || index<0){
				throwCppExceptionMessage("Access to definitions out of range",errorUndefinedWord);
			}
			return definitions.at(index);
		}

		/****

		The inner-definition interpreter needs a pointer to the next instruction to be
		executed.  This will be explained below in the **Inner Interpreter** section.

		****/
		Xt next_command{0};

		/****

		There are a few special words whose XTs I will use frequently when compiling
		or executing.  Rather than looking them up in the dictionary as needed, I'll
		cache their values during initialization.

		****/


		/****

		I need a flag to track whether we are in interpreting or compiling state.
		This corresponds to Forth's `STATE` variable.

		****/


		/****

		I provide a variable that controls the numeric base used for conversion
		between numbers and text.  This corresponds to the Forth `BASE` variable.

		Whenever using C++ stream output operators, I will need to ensure the stream's
		numeric output base matches `numericBase`.  To make this easy, I'll define a
		macro `SETBASE()` that calls the `std::setbase` I/O manipulator and use it
		whenever writing numeric data using the stream operators.

		****/

#define SETBASE() std::setbase(static_cast<int>(getNumericBase())) 

		/****

		The input buffer is a `std::vector<Char>`.  This makes it easy to use the C++ I/O
		facilities, and frees me from the need to allocate a statically sized buffer
		that could overflow.  I also have a current offset into this buffer,
		corresponding to the Forth `>IN` variable.

		****/


		void setSourceAddress(Cell value) {
			setDataCell(VarOffsetSourceAddress, value);
		}
		Cell getSourceAddress() {
			return getDataCell(VarOffsetSourceAddress);
		}

		void setSourceBufferSize(Cell value){
			setDataCell(VarOffsetSourceSize, value);
		}
		Cell getSourceBufferSize() {
			return getDataCell(VarOffsetSourceSize);
		}

		bool setSourceBuffer(){
			if (inputBufferStringsCurrent < inputBufferStrings.size()){
				// load next string from input buffer
				const std::string &value = inputBufferStrings.at(inputBufferStringsCurrent);
				auto address=setVirtualMemory(value,vmSegmentSourceBufferRefill);
				setSourceVariables(address, CELL(value.size()), 0);
				return true;
			}
			else {
				// fill input buffer by zero length vector
				assert(!"Should not be here");
				setSourceVariables(VirtualMemory.at(vmSegmentSourceBufferRefill).start, 0, 0); // @bug - check when this condition happens
				return false;
			}
		}
		/// <summary>
		/// Set information bout source buffer
		/// </summary>
		/// <param name="Source">SOURCE buffer address</param>
		/// <param name="sourceSize">SOURCE size</param>
		/// <param name="sourceMoreIn"> >IN variable value </param>
		void setSourceVariables(Cell Source, Cell sourceSize, Cell sourceMoreIn) {
			setSourceAddress(Source);
			setSourceBufferSize(sourceSize);
			setSourceBufferOffset(sourceMoreIn);
		}
		void getSourceVariables(Cell &Source, Cell &sourceSize, Cell &sourceMoreIn) {
			Source=getSourceAddress();
			sourceSize=getSourceBufferSize();
			sourceMoreIn=getSourceBufferOffset();
		}
		/// <summary>
		///  set Source Buffer offset
		/// </summary>
		/// <param name="value"> Value if >IN variable</param>
		void setSourceBufferOffset(Cell value){
			setDataCell(VarOffsetSourceOffset, value);
		}
		Cell getSourceBufferOffset(){
			return getDataCell(VarOffsetSourceOffset);
		}
		void incSourceBufferOffset(){
			setSourceBufferOffset(getSourceBufferOffset() + 1);
		}
		int getSourceBufferRemain() {
			return getSourceBufferSize() - getSourceBufferOffset();
		}
		void setNumericBase(Cell value){
			setDataCell(VarOffsetNumericBase, value);
		}
		Cell getNumericBase(){
			return getDataCell(VarOffsetNumericBase);
		}

		/****

		the pictured numeric output buffer is a `std::vector<Char>`.  This makes it easy to use the C++ I/O
		facilities, and frees me from the need to allocate a statically sized buffer
		that could overflow. 

		****/
		std::vector<Char> picturedInputBuffer;
		
		/****

		----

		Stack Primitives
		----------------

		I will be doing a lot of pushing and popping values to and from our data and
		return stacks, so in lieu of sprinkling pointer arithmetic throughout our code,
		I'll define a few simple functions to handle those operations.  I expect the
		compiler to expand calls to these functions inline, so this isn't inefficient.

		Above I defined the global variables `dTop` and `rTop` to point to the top of
		the data stack and return stack.  I will use the expressions `getDTop()` and
		`getRTop()` when accessing the top-of-stack values.  I will also use expressions
		like `getDTop( 1 )` and `getDTop( 2 )` to reference the items beneath the top of
		stack.

		When I need to both read and remove a top-of-stack value, my convention will
		be to put both operations on the same line, like this:

		Cell x = getDtop(); pop();

		A more idiomatic C++ way to write this might be `Cell x = *(dTop--);`, but I
		think that's less clear.

		****/



		// Push cell onto data stack.
		void push(Cell x) {
			dStack.push( x );
		}

		// Pop cell from data stack.
		void pop() {
			dStack.pop();
		}

		// Push cell onto return stack.
		void rpush(Cell x) {
			rStack.push( x );
		}

		// Pop cell from return stack.
		void rpop() {
			rStack.pop();
		}

		/****

		----

		Exceptions
		----------

		Forth provides the `ABORT` and `ABORT"` words, which interrupt execution and
		return control to the main `QUIT` loop.  I will implement this functionality
		using a C++ std::exception to return control to the top-level interpreter.

		The C++ functions `abort()` and `abortMessage()` defined here are the first
		primitive functions that will be exposed as Forth words.  For each such word, I
		will spell out the Forth name of the primitive in all-caps, and provide a Forth
		comment showing the stack effects.  For words described in the standards, I
		will generally not provide any more information, but for words that are not
		standard words, I'll provide a brief description.

		****/
		public:
		class AbortException : public std::runtime_error {
		public:
			AbortException(const std::string& msg) : std::runtime_error(msg) {}
			AbortException(const char* msg) : std::runtime_error(msg) {}
		};
		private:
			enum errorCodes {
				errorAbort = -1,
				errorAbortQuote = -2,
				errorStackOverflow =-3,
				errorStackUnderflow=-4,
				errorRStackOverflow=-5,
				errorRStackUnderflow=-6,
				errorInvalidAddress=-9,
				errorDivisionByZero=-10,
				errorUndefinedWord=-13,
				errorParsedStringOverflow=-18,
				errorUnsupportedOperation=-21,
				errorAdressAlignment=-23,
				errorControlStackOverflow=-52,
				errorAllocate=-59,
				errorFree=-60,
				errorResize=-61,
				errorCloseFile=-62,
				errorCreateFile=-63,
				errorDeleteFile=-64,
				errorFilePosition=-65,
				errorFileSize = -66,
				errorFileStatus = -67,
				errorFlushFile=-68,
				errorOpenFile=-69,
				errorReadFile=-70,
				errorReadLine=-71,
				errorRenameFile=-72,
				errorResizeFile=-74,
				errorWriteFile=-75,
				errorWriteLine=-76
			} ;
			/*
Code Reserved for	Code Reserved for
-1	ABORT
-2	ABORT"
-3	stack overflow
-4	stack underflow
-5	return stack overflow
-6	return stack underflow
-7	do-loops nested too deeply during execution
-8	dictionary overflow
-9	invalid memory address
-10	division by zero
-11	result out of range
-12	argument type mismatch
-13	undefined word
-14	interpreting a compile-only word
-15	invalid FORGET
-16	attempt to use zero-length string as a name
-17	pictured numeric output string overflow
-18	parsed string overflow
-19	definition name too long
-20	write to a read-only location
-21	unsupported operation
(e.g., AT-XY on a too-dumb terminal)
-22	control structure mismatch
-23	address alignment exception
-24	invalid numeric argument
-25	return stack imbalance
-26	loop parameters unavailable
-27	invalid recursion
-28	user interrupt
-29	compiler nesting
-30	obsolescent feature
-31	>BODY used on non-CREATEd definition
-32	invalid name argument (e.g., TO name)
-33	block read exception
-34	block write exception
-35	invalid block number
-36	invalid file position
-37	file I/O exception
-38	non-existent file
-39	unexpected end of file
-40	invalid BASE for floating point conversion
-41	loss of precision
-42	floating-point divide by zero
-43	floating-point result out of range
-44	floating-point stack overflow
-45	floating-point stack underflow
-46	floating-point invalid argument
-47	compilation word list deleted
-48	invalid POSTPONE
-49	search-order overflow
-50	search-order underflow
-51	compilation word list changed
-52	control-flow stack overflow
-53	exception stack overflow
-54	floating-point underflow
-55	floating-point unidentified fault
-56	QUIT
-57	exception in sending or receiving a character
-58	[IF], [ELSE], or [THEN] exception
-59	ALLOCATE
-60	FREE
-61	RESIZE
-62	CLOSE-FILE
-63	CREATE-FILE
-64	DELETE-FILE
-65	FILE-POSITION
-66	FILE-SIZE
-67	FILE-STATUS
-68	FLUSH-FILE
-69	OPEN-FILE
-70	READ-FILE
-71	READ-LINE
-72	RENAME-FILE
-73	REPOSITION-FILE
-74	RESIZE-FILE
-75	WRITE-FILE
-76	WRITE-LINE
-77	Malformed xchar
-78	SUBSTITUTE
-79	REPLACES
*/
		void initClass(){
			// clear datastack
			dStack.resetStack();
			// clear return stack
			rStack.resetStack();
			returnStack.resetStack();
			// clear floating point stack
			// clear control stacks
			controlStackLoops.resetStack();
			// control stack for IF ELSE THEN Begin While Repeat Until Again
			controlStackIf_Begin.resetStack();
			// clear excepion stack
			catchStack.resetStack();
			// clear source/evaluation stack
			while (RestoreInput()); // returns depth of the stack decremented by 1 every call . Or returns 0; 
			// next operation to 0
			next_command = 0;
			// interpretation state
			InterpretState = InterpretSource;
			// SOURCE-ID =0
		}
		void throwMessage(const std::string &msg, enum errorCodes ec){
			initClass();
			std::string buffer{};
			int ecInt=static_cast<int>(ec);
			moveFromDataSpace(buffer, getSourceAddress(), getSourceBufferSize());
			dStack.push(ec);
			exceptionsThrow();
			//throw AbortException(msg + "\nError code " + std::to_string(ecInt) +"\n" + buffer + "\n Offset " + std::to_string(getSourceBufferOffset()));
		}
		void throwCppExceptionMessage(const std::string &msg, enum errorCodes ec){
			initClass();
			std::string buffer{};
			int ecInt=static_cast<int>(ec);
			moveFromDataSpace(buffer, getSourceAddress(), getSourceBufferSize());
			throw AbortException(msg + "\nError code " + std::to_string(ecInt) +"\n" + buffer + "\n Offset " + std::to_string(getSourceBufferOffset()));
		}
		// ABORT ( i*x -- ) ( R: j*x -- )
		void abort() {
			throwMessage("Abort",errorAbort);
		}
		// ABORT-MESSAGE ( i*x c-addr u -- ) ( R: j*x -- )
		// 
		// Not a standard word.
		//
		// Same semantics as the standard ABORT", but takes a string address and length
		// instead of parsing the message string.
		void abortMessage() {
			auto count = dStack.getTop(); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			std::string message{};
			assignStringFromCaddress(message,caddr, count);
			// same action as abort()
			throwMessage(message,errorAbortQuote);
		}

		/****

		----

		Runtime Safety Checks
		---------------------

		Old-school Forths are implemented by super-programmers who never make coding
		mistakes and so don't want the overhead of bounds-checking or other nanny
		hand-holding.  However, I'm just a dumb C++ programmer, and I'd like some help
		to catch mistakes.

		To that end, I have a set of macros and functions that verify that we have the
		expected number of arguments available on our stacks, that we aren't going to
		run off the end of an array, that we aren't going to try to divide by zero, and
		so on.

		You can define the macro `FORTHSCRIPTCPP_SKIP_RUNTIME_CHECKS` to generate an
		executable that doesn't include these checks, so when you have a fully debugged
		Forth application you can run it on that optimized executable for improved
		performance.

		When the `FORTHSCRIPTCPP_SKIP_RUNTIME_CHECKS` macro is not defined, these macros will
		check conditions and throw an `AbortException` if the assertions fail.  I won't
		go into the details of these macros here.  Later we will see them used in the
		definitions of our primitive Forth words.

		****/
#define RUNTIME_NO_OP()                      do { } while (0)

#ifdef FORTHSCRIPTCPP_SKIP_RUNTIME_CHECKS

#define RUNTIME_ERROR(msg)                   RUNTIME_NO_OP()
#define RUNTIME_ERROR_IF(cond, msg)          RUNTIME_NO_OP()
#define REQUIRE_DSTACK_DEPTH(n, name)        RUNTIME_NO_OP()
#define REQUIRE_DSTACK_AVAILABLE(n, name)    RUNTIME_NO_OP()
#define REQUIRE_RSTACK_DEPTH(n, name)        RUNTIME_NO_OP()
#define REQUIRE_RSTACK_AVAILABLE(n, name)    RUNTIME_NO_OP()
#define REQUIRE_ALIGNED(addr, name)          RUNTIME_NO_OP()
#define REQUIRE_VALID_HERE(name)             RUNTIME_NO_OP()
#define REQUIRE_DATASPACE_AVAILABLE(n, name) RUNTIME_NO_OP()

#else

#define RUNTIME_ERROR(msg,ec)                   do { throwCppExceptionMessage(msg,ec); } while (0)
#define RUNTIME_ERROR_IF(cond, msg,ec)          do { if (cond) RUNTIME_ERROR(msg,ec); } while (0)
#define REQUIRE_DSTACK_DEPTH(n, name)        requireDStackDepth(n, name)
#define REQUIRE_DSTACK_AVAILABLE(n, name)    requireDStackAvailable(n, name)
#define REQUIRE_RSTACK_DEPTH(n, name)        requireRStackDepth(n, name)
#define REQUIRE_RSTACK_AVAILABLE(n, name)    requireRStackAvailable(n, name)
#define REQUIRE_CSTACK_DEPTH(n, name)        requireCStackDepth(n, name)
#define REQUIRE_CSTACK_AVAILABLE(n, name)    requireCStackAvailable(n, name)
#define REQUIRE_ALIGNED(addr, name)          RUNTIME_NO_OP()
//#define REQUIRE_ALIGNED(addr, name)          checkAligned(addr, name)
#define REQUIRE_VALID_HERE(name)             checkValidHere(name)
#define REQUIRE_DATASPACE_AVAILABLE(n, name) requireDataSpaceAvailable(n, name)

		template<typename T>
		void checkAligned(T addr, const char* name) {
			RUNTIME_ERROR_IF((CELL(addr) % CellSize) != 0,
				std::string(name) + ": unaligned address",errorAdressAlignment);
		}

		void requireDStackDepth(std::size_t n, const char* name) {
			RUNTIME_ERROR_IF(dStack.stackDepth() < (n),
				std::string(name) + ": stack underflow",errorStackUnderflow);
		}

		void requireDStackAvailable(std::size_t n, const char* name) {
			RUNTIME_ERROR_IF(!dStack.availableStack(n),
				std::string(name) + ": stack overflow",errorStackOverflow);
		}

		void requireCStackDepth(std::size_t n, const char* name) {
			RUNTIME_ERROR_IF(controlStackIf_Begin.stackDepth() < (n),
				std::string(name) + ": control stack underflow",errorControlStackOverflow);
		}

		void requireCStackAvailable(std::size_t n, const char* name) {
			RUNTIME_ERROR_IF(!controlStackIf_Begin.availableStack(n),
				std::string(name) + ": control stack overflow",errorControlStackOverflow);
		}

		void requireRStackDepth(std::size_t n, const char* name) {
			RUNTIME_ERROR_IF(rStack.stackDepth() < (n),
				std::string(name) + ": return stack underflow",errorRStackUnderflow);
		}

		void requireRStackAvailable(std::size_t n, const char* name) {
			RUNTIME_ERROR_IF(!rStack.availableStack(n),
				std::string(name) + ": return stack overflow",errorRStackOverflow);
		}

		void checkValidHere(const char* name) {
			RUNTIME_ERROR_IF(getDataPointer() < VirtualMemory[vmSegmentDataSpace].start || 
				VirtualMemory[vmSegmentDataSpace].end <= getDataPointer(),
				std::string(name) + ": HERE outside data space "+std::to_string(getDataPointer()),errorInvalidAddress);
		}

		void requireDataSpaceAvailable(std::size_t n, const char* name) {
			RUNTIME_ERROR_IF((getDataPointer() + n) >= VirtualMemory[vmSegmentDataSpace].end , //dataSpace.size(),
				std::string(name) + ": data space overflow", errorInvalidAddress);
		}

#endif // FORTHSCRIPTCPP_SKIP_RUNTIME_CHECKS

		/****

		----

		Forth Primitives
		----------------

		Now I will start defining the primitive operations that are exposed as Forth
		words.  You can think of these as the opcodes of a virtual Forth processor.
		Once we have our primitive operations defined, we can then write definitions in
		Forth that use these primitives to build more-complex words.

		Each of these primitives is a function that takes no arguments and returns no
		result, other than its effects on the Forth data stack, return stack, and data
		space.  Such a function can be assigned to the `code` field of a `Definition`.

		When changing the stack, the primitives don't change the stack depth any more
		than necessary.  For example, `PICK` just replaces the top-of-stack value with
		a different value, and `ROLL` uses `std::memmove()` to rearrange elements
		rather than individually popping and pushng them.

		You can peek ahead to the `definePrimitives()` function to see how these
		primitives are added to the Forth dictionary.

		Forth Stack Operations
		----------------------

		Let's start with some basic Forth stack manipulation words.  These differ from
		the push/pop/rpush/rpop/etc. primitives above in that they are intended to be
		called from Forth code rather than from the C++ kernel code.  So I include
		runtime checks and use the stacks rather than passing arguments or returning
		values via C++ call/return mechanisms.

		Note that for C++ functions that implement primitive Forth words, I will
		include the Forth names and stack effects in comments. You can look up the
		Forth names in the standards to learn what these words are supposed to do.

		****/

		// DEPTH ( -- +n )
		void depth() {
			REQUIRE_DSTACK_AVAILABLE(1, "DEPTH");
			push(static_cast<Cell>(dStack.stackDepth()));
		}

		// DROP ( x -- )
		void drop() {
			REQUIRE_DSTACK_DEPTH(1, "DROP");
			pop();
		}

		// 2DROP ( x x -- )
		void drop2() {
			REQUIRE_DSTACK_DEPTH(2, "2DROP");
			pop();
			pop();
		}

		// 2DUP ( x y -- x y x y )
		void dup2() {
			REQUIRE_DSTACK_DEPTH(2, "2DUP");
			REQUIRE_DSTACK_AVAILABLE(2, "2DUP");
			dStack.push(dStack.getTop(1));
			dStack.push(dStack.getTop(1));
		}
		// DUP ( x  -- x x )
		void dup() {
			REQUIRE_DSTACK_DEPTH(1, "DUP");
			REQUIRE_DSTACK_AVAILABLE(1, "DUP");
			dStack.push(dStack.getTop(0));
		}
		// 1+ ( x x0 u -- x+1 )
		void plus1() {
			REQUIRE_DSTACK_DEPTH(1, "1+");
			dStack.setTop(dStack.getTop(0)+1);
		}

		// PICK ( xu ... x1 x0 u -- xu ... x1 x0 xu )
		void pick() {
			REQUIRE_DSTACK_DEPTH(1, "PICK");
			auto index = dStack.getTop();
			REQUIRE_DSTACK_DEPTH(index + 2, "PICK");
			dStack.setTop(dStack.getTop(index + 1));
		}

		// ROLL ( xu xu-1 ... x0 u -- xu-1 ... x0 xu )
		void roll() {
			REQUIRE_DSTACK_DEPTH(1, "ROLL");
			auto n = dStack.getTop(); pop();
			if (n > 0) {
				REQUIRE_DSTACK_DEPTH(n + 1, "ROLL");
				auto x = dStack.getTop(n);
				dStack.moveStack(n, n - 1, n);
				dStack.setTop(x);
			}
		}
		// rot ( X Y Z -- Y Z X  )
		void rot() {
			REQUIRE_DSTACK_DEPTH(3, "ROT");
			auto n = 2;
			if (n > 0) {
				auto x = dStack.getTop(n);
				dStack.moveStack(n, n - 1, n);
				dStack.setTop(x);
			}
		}
		// swap ( X Y  -- Y  X  )
		void swap() {
			REQUIRE_DSTACK_DEPTH(2, "SWAP");
			auto n = 1;
			if (n > 0) {
				auto x = dStack.getTop(n);
				dStack.moveStack(n, n - 1, n);
				dStack.setTop(x);
			}
		}

		// >R ( x -- ) ( R:  -- x )
		void toR() {
			REQUIRE_DSTACK_DEPTH(1, ">R");
			REQUIRE_RSTACK_AVAILABLE(1, ">R");
			rpush(dStack.getTop()); pop();
		}

		// R> ( -- x ) ( R: x -- )
		void rFrom() {
			REQUIRE_RSTACK_DEPTH(1, "R>");
			REQUIRE_DSTACK_AVAILABLE(1, "R>");
			push(rStack.getTop()); rpop();
		}

		// R@ ( -- x ) ( R: x -- x )
		void rFetch() {
			REQUIRE_RSTACK_DEPTH(1, "R@");
			REQUIRE_DSTACK_AVAILABLE(1, "R@");
			push(rStack.getTop());
		}

		/****

		Another important set of Forth primitives are those for reading and writing
		values in data space.

		****/

		// ! ( x a-addr -- )
		void store() {
			REQUIRE_DSTACK_DEPTH(2, "!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "!");
			auto x = dStack.getTop(); pop();
			setDataCell( aaddr , x );
		}

		// @ ( a-addr -- x )
		void fetch() {
			REQUIRE_DSTACK_DEPTH(1, "@");
			auto aaddr = AADDR(dStack.getTop());
			REQUIRE_ALIGNED(aaddr, "@");
			dStack.setTop(getDataCell(aaddr));
		}

		// c! ( char c-addr -- )
		void cstore() {
			REQUIRE_DSTACK_DEPTH(2, "C!");
			auto caddr = CADDR(dStack.getTop()); pop();
			auto x = static_cast<Char>(dStack.getTop()); pop();
			setDataChar(caddr, x);
			
		}

		// c@ ( c-addr -- char )
		void cfetch() {
			REQUIRE_DSTACK_DEPTH(1, "C@");
			auto caddr = CADDR(dStack.getTop());
			dStack.setTop(static_cast<Cell>(getDataChar( caddr )));
		}

		// COUNT ( c-addr1 -- c-addr2 u )
		void count() {
			REQUIRE_DSTACK_DEPTH(1, "COUNT");
			REQUIRE_DSTACK_AVAILABLE(1, "COUNT");
			auto caddr = CADDR(dStack.getTop());
			auto count = static_cast<Cell>(getDataChar(caddr));
			dStack.setTop(CELL(caddr + 1));
			push(count);
		}
		// -TRAILING ( c-addr1 u1 -- c-addr2 u2 )
		void dashtrailing() {
			REQUIRE_DSTACK_DEPTH(2, "COUNT");
			auto caddr = CADDR(dStack.getTop(1));
			SCell count = dStack.getTop(0);
			while(count>0){
			auto trailingChar = (getDataChar(caddr+count-1));
			if(trailingChar==' '){
				count--;
			} else {
				break;
			}
			}
			//Nothing done
			dStack.setTop(static_cast<Cell>(count));
		}

		/****

		Next, I'll define some primitives for accessing and manipulating the data-space
		pointer, `HERE`.

		****/

		template<typename T>
		AAddr alignAddress(T addr) {
			return addr; // vector storage does not need alignment
			// old version of alignment
			//auto offset = CELL(addr) % CellSize;
			//return (offset == 0) ? AADDR(addr) : AADDR(CADDR(addr) + (CellSize - offset));
		}

		void alignDataPointer() {
			setDataPointer( CADDR(alignAddress(getDataPointer())) );
		}

		// ALIGN ( -- )
		void align() {
			alignDataPointer();
			REQUIRE_VALID_HERE("ALIGN");
		}

		// ALIGNED ( addr -- a-addr )
		void aligned() {
			REQUIRE_DSTACK_DEPTH(1, "ALIGNED");
			return; // data always aligned
			// version with alignment
			// dStack.setTop(CELL(alignAddress(dStack.getTop())));
		}

		// HERE ( -- addr )
		void here() {
			REQUIRE_DSTACK_AVAILABLE(1, "HERE");
			push(CELL(getDataPointer()));
		}

		// ALLOT ( n -- )
		void allot() {
			REQUIRE_DSTACK_DEPTH(1, "ALLOT");
			REQUIRE_VALID_HERE("ALLOT");
			REQUIRE_DATASPACE_AVAILABLE(CellSize, "ALLOT");
			incDataPointer( static_cast<SCell>( dStack.getTop() ) ); pop();
		}

		// CELLS ( n1 -- n2 )
		void cells() {
			REQUIRE_DSTACK_DEPTH(1, "CELLS");
			dStack.setTop(static_cast<SCell>(dStack.getTop())*CellSize);
		}

		// Store a cell to data space.
		void data(Cell x) {
			REQUIRE_VALID_HERE(",");
			REQUIRE_DATASPACE_AVAILABLE(CellSize, ",");
			REQUIRE_ALIGNED(getDataPointer(), ",");
			setDataCell((AADDR(getDataPointer())) , x );
			incDataPointer( CellSize );
		}

		// UNUSED ( -- u )
		void unused() {
			REQUIRE_DSTACK_AVAILABLE(1, "UNUSED");
			push(static_cast<Cell>(VirtualMemory[vmSegmentDataSpace].end - getDataPointer()));
		}

		/****

		I could implement memory-block words like `CMOVE`, `CMOVE>` and `FILL` in
		Forth, but speed is often important for these, so I will make them native
		primitives.

		****/

		// CMOVE ( c-addr1 c-addr2 u -- )
		void cMove() {
			REQUIRE_DSTACK_DEPTH(3, "CMOVE");
			auto length = dStack.getTop(); pop();
			auto dst = CADDR(dStack.getTop()); pop();
			auto src = CADDR(dStack.getTop()); pop();
			for (Cell i = 0; i < length; ++i) {
				dataSpaceSet(dst + i, dataSpaceAt(src + i));
			}
		}

		// CMOVE> ( c-addr1 c-addr2 u -- )
		void cMoveUp() {
			REQUIRE_DSTACK_DEPTH(3, "CMOVE>");
			auto length = dStack.getTop(); pop();
			auto dst = CADDR(dStack.getTop()); pop();
			auto src = CADDR(dStack.getTop()); pop();
			for (Cell i = 0; i < length; ++i) {
				auto offset = length - i - 1;
				dataSpaceSet(dst + offset, dataSpaceAt(src + offset));
			}
		}

		// FILL ( c-addr u char -- )
		void fill() {
			REQUIRE_DSTACK_DEPTH(3, "FILL");
			auto ch = static_cast<Char>(dStack.getTop()); pop();
			auto length = dStack.getTop(); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			for (Cell i = 0; i < length; ++i) {
				dataSpaceSet(caddr + i, ch);
			}
		}

		// COMPARE ( c-addr1 u1 c-addr2 u2 -- n )
		void compare(){
			REQUIRE_DSTACK_DEPTH(4, "COMPARE");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); pop();
			auto length1 = dStack.getTop(); pop();
			auto caddr1 = CADDR(dStack.getTop()); 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{};
			moveFromDataSpace(Word2, caddr2, length2);
			auto result = Word1.compare(Word2);
			dStack.setTop((result < 0) ? -1 : ((result > 0) ? 1 : 0)); 
		}

		std::map<std::string,std::string> replacesSubstitute{};
		// REPLACES ( c-addr1 u1 c-addr2 u2 --  )
		void replaces(){
			REQUIRE_DSTACK_DEPTH(4, "REPLACES");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); pop();
			auto length1 = dStack.getTop(); pop();
			auto caddr1 = CADDR(dStack.getTop());pop(); 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{};
			moveFromDataSpace(Word2, caddr2, length2);
			for(auto &c : Word2) c=toupper_ascii(c);
			auto itfound=replacesSubstitute.find(Word1);
			if(Word2.size()==0){
				int a=1;
				a=a+1;
			}
			if(itfound!=replacesSubstitute.end()){
				replacesSubstitute.insert(std::pair<std::string,std::string>(Word2,Word1));
			} else {
				replacesSubstitute[Word2]=Word1;
			}
			//dStack.setTop((result < 0) ? -1 : ((result > 0) ? 1 : 0)); 
		}
		// SUBSTITUTE ( c-addr1 u1 c-addr2 u2 --  )
		void substitute(){
			REQUIRE_DSTACK_DEPTH(4, "SUBSTITUTE");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); ;
			auto length1 = dStack.getTop(1); ;
			auto caddr1 = CADDR(dStack.getTop(2));; 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{}, key{}, keyUpper{};
			auto result = 0;
			auto processedIt=0;
			auto processEnd=Word1.size();
			// start processing of Word1
			while(processedIt<processEnd){
				//auto nextPercent=std::find(processedIt,processEnd,'%');
				auto nextPercent=Word1.find('%',processedIt);
				if(nextPercent==std::string::npos){
					// copy chars to buffer and exit from loop
					Word2.append(Word1.substr(processedIt,processEnd-processedIt));
					break;	
				}
				// copy chars before percent char
				Word2.append(Word1.substr(processedIt,nextPercent-processedIt));
				processedIt=nextPercent+1;
				if(processedIt>=processEnd) {
					Word2.append("%");
					break;
				} 
				nextPercent=Word1.find('%',processedIt);
				if(nextPercent==std::string::npos){
					// unclosed percent chars - everything copied to the buffer
					 Word2.append("%");
					 Word2.append(Word1.substr(processedIt,processEnd-processedIt));
					 break;
				}
				if(nextPercent==processedIt){
					// two percents replaced by one percent
					Word2.append("%");
					++processedIt;
					continue;
				}
				key=Word1.substr(processedIt,nextPercent-processedIt);
				keyUpper=key;
				for(auto &c : keyUpper) c=toupper_ascii(c);
				auto foundIt=replacesSubstitute.find(keyUpper);
				if(foundIt==replacesSubstitute.end()){
					Word2.append("%").append(key).append("%");
				} else {
				 Word2.append((*foundIt).second);
				 ++result;
				}
				processedIt=nextPercent+1;
			}
			if(Word2.size()> length2) {
				result=-1;
			} else {
				moveIntoDataSpace( caddr2, Word2.c_str(), CELL(Word2.size()));
				dStack.setTop(1, CELL(Word2.size()) );
				dStack.setTop(2, CELL(caddr2) );

			}
			dStack.setTop((result < 0) ? -1 : result ); 
		}
		/// SEARCH ( c-addr1 u1 c-addr2 u2 -- c-addr3 u3 flag )
		//Search the string specified by c-addr1 u1 for the string specified by c-addr2 u2. 
		//If flag is true, a match was found at c-addr3 with u3 characters remaining. 
		//If flag is false there was no match and c-addr3 is c-addr1 and u3 is u1.
		void search(){
			REQUIRE_DSTACK_DEPTH(4, "SEARCH");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); 
			auto length1 = dStack.getTop(1); 
			auto caddr1 = CADDR(dStack.getTop(2)); 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{};
			moveFromDataSpace(Word2, caddr2, length2);
			auto result = Word1.find(Word2,0);
			if(result!=std::string::npos){
				dStack.setTop(True);
				dStack.setTop(1,length1-CELL(result));
				dStack.setTop(2,caddr1+CELL(result));

			} else {
				dStack.setTop(False);
				// dStack.setTop(1,length1); // not changed
				// dStack.setTop(2,caddr1);	 // not changed
			}
			
		}

		/****

		Next I will define I/O primitives.

		I keep things simple and portable by using C++ iostream objects.

		****/
		public:
		enum InputSource {
			FromString = 0,
			FromStdCin = 1
		};
		private:
		enum InputSource readFromSource{};
		public:
		void setInputSource(enum InputSource source){
			readFromSource = source;
		}

#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
		public:
			enum WriteTarget {
				ToString = 0,
				ToStdCout = 1
			};
		private:
			enum WriteTarget writeToTarget{};
		public:
			void setWriteTarget(enum WriteTarget target){
				writeToTarget = target;
			}

#endif
		private:
		// KEY ( -- char )
			void key() {
				REQUIRE_DSTACK_AVAILABLE(1, "KEY");
				SCell ch = EOF;
				switch (readFromSource) {
				case FromString:
					std_cin.clear();
					ch = static_cast<SCell>(std_cin.get());
					break;
				case FromStdCin:
					std::cin.clear();
					ch = static_cast<SCell>(std::cin.get());
					break;
				default:
					break;
			}
			push(ch);
		}
		// KEY? ( -- flag )
		void key_question() {
			REQUIRE_DSTACK_AVAILABLE(1, "KEY?");
			Cell flag{} ;
			switch (readFromSource) {
				case FromString:
					std_cin.clear();
					flag = std_cin.rdbuf()->in_avail() > 0 ? True : False;
					break;
				case FromStdCin:
					std::cin.clear(); // clear previous error codes
					std::cin.sync();
					std::cin.sync_with_stdio(true);
					std::cin.rdbuf()->pubsync();
					flag = std::cin.rdbuf()->in_avail() > 0 ? True : False;
					break;
				default:
					break;
			}
			push(flag);
		}

		// EMIT ( x -- )
		void emit() {
			REQUIRE_DSTACK_DEPTH(1, "EMIT");
			auto cell = dStack.getTop(); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout.clear();
				std_cout.put(static_cast<char>(cell));
				break;
			case ToStdCout:
				std::cout.put(static_cast<char>(cell)); std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}

		// TYPE ( c-addr u -- )
		void type() {
			REQUIRE_DSTACK_DEPTH(2, "TYPE");
			auto length = static_cast<std::streamsize>(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			while (length-- > 0){
				char ch = dataSpaceAt(caddr++);
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				switch (writeToTarget) {
				case ToString:
					std_cout.write(&ch, 1);
					break;
				case ToStdCout:
					std::cout.write(&ch, 1);
				    std::cout.flush();
					break;
				default:
					break;
				}
#endif
			}
		}

		// CR ( -- )
		void cr() {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << std::endl;
				break;
			case ToStdCout:
				std::cout << std::endl;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}

		// . ( n -- )
		void dot() {
			REQUIRE_DSTACK_DEPTH(1, ".");
			auto value = static_cast<SCell>(static_cast<int>(dStack.getTop())); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << value <<" ";
				break;
			case ToStdCout:
				std::cout << SETBASE() << value << " ";
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}

		// U. ( x -- )
		void uDot() {
			REQUIRE_DSTACK_DEPTH(1, "U.");
			auto value = static_cast<Cell>(dStack.getTop()); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << value << " ";
				break;
			case ToStdCout:
				std::cout << SETBASE() << value << " ";
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}

		// .R ( n1 n2 -- )
		void dotR() {
			REQUIRE_DSTACK_DEPTH(2, ".R");
			auto width = static_cast<int>(dStack.getTop()); pop();
			auto n = static_cast<SCell>(dStack.getTop()); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << std::setw(width) << n;
				break;
			case ToStdCout:
				std::cout << SETBASE() << std::setw(width) << n;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}

		// BASE ( -- a-addr )
		void base() {
			REQUIRE_DSTACK_AVAILABLE(1, "BASE");
			push(CELL(VarOffsetNumericBase));
		}

		// SOURCE ( -- c-addr u )
		void source() {
			REQUIRE_DSTACK_AVAILABLE(2, "SOURCE");
			push(getDataCell(VarOffsetSourceAddress)); 
			push(getDataCell(VarOffsetSourceSize));
		}
		// SOURCE-ID ( -- n )
		Cell sourceid{};
		void sourcedashid() {
			REQUIRE_DSTACK_AVAILABLE(1, "SOURCE-ID");
			push(sourceid); 
		}
		void setSourceId(SCell value) {
			sourceid = value;
		}
		SCell getSourceId() {
			return sourceid;
		}

		// >IN ( -- a-addr )
		void toIn() {
			REQUIRE_DSTACK_AVAILABLE(1, ">IN");
			push(VarOffsetSourceOffset);
		}
		// PAD ( -- c-addr )
		void pad() {
			REQUIRE_DSTACK_AVAILABLE(1, "PAD");
			push(CELL(VarOffsetPadBuffer));
		}

		/****

		`REFILL` reads a line from the user input device.  If successful, it puts the
		result into `sourceBuffer`, sets `sourceOffset` to 0, and pushes a `TRUE` flag
		onto the stack.  If not successful, it pushes a `FALSE` flag.

		****/
		/// refillNextLine() is not REFILL. It only read next line from input source
		/// and does not take into consideretion BLK variable. It is used internally to refill source buffer
		/// return true if source buffer is refilled
		bool refillNextLine() {
			REQUIRE_DSTACK_AVAILABLE(1, "REFILLNEXTLINE");
			auto sourceid_ = getSourceId();
			auto blk = getDataCell(VarOffsetBlkAddress);
			if (sourceid_ >= 0 and blk==0) { // if input from file or from input buffer
				inputBufferStringsCurrent++;
				if (inputBufferStringsCurrent < inputBufferStrings.size()) {
					if (setSourceBuffer()) {
						//std::cerr << inputBufferStrings[inputBufferStringsCurrent];
							
						return true;
					}
					else {
						return false;
					}
				}
				else {
					return false;
				}
			}
			else {
				return false; // input from EVALUATE and LOAD
			}
			
		}

		// REFILL ( -- flag )
		void refill() { 
			REQUIRE_DSTACK_AVAILABLE(1, "REFILL");
			auto sourceid_ = getSourceId();
			auto blk=getDataCell(VarOffsetBlkAddress);
			if (blk > 0) {
				++blk;
				dStack.push(blk);
				block();
				auto address=dStack.getTop();pop();
				setSourceId(0);
				setDataCell(VarOffsetBlkAddress, Cell(blk)); // set BLK=u
				setSourceVariables(address, 1024, 0);
				push(True);
			}
			else {
				if (sourceid_ >= 0) { // if input from file or from input buffer
					inputBufferStringsCurrent++;
					if (inputBufferStringsCurrent < inputBufferStrings.size()) {
						if (setSourceBuffer()) {
							push(True);
						}
						else {
							push(False);
						}
					}
					else {
						push(False);
					}
				}
				else {
					push(False); // input from EVALUATE
				}
			}
		}

		/****

		`ACCEPT`  reads a line from the user input device and puts the result into a caller-supplied
		buffer.

		****/

		// ACCEPT ( c-addr +n1 -- +n2 )
		void accept() {
			REQUIRE_DSTACK_AVAILABLE(2, "ACCEPT");
			auto bufferSize = SIZE_T(dStack.getTop()); pop();
			auto buffer = CAddr(dStack.getTop());
			std::string line{};
			switch (readFromSource) {
			case FromString:
				std_cin.clear();
				std::getline(std_cin, line);
				std_cin.clear();
				break;
			case FromStdCin:
				std::cin.clear();
				std::getline(std::cin, line);
				std::cin.clear();
				break;
			default:
				break;
			}
				auto copySize = std::min(line.length(), bufferSize);
				for (Cell i = 0; i < copySize; ++i) {
					dataSpaceSet(buffer + i, line.at(i));
				}
				dStack.setTop(static_cast<Cell>(copySize));
		}

		/****

		The text interpreter and other Forth words use `WORD` to parse a
		blank-delimited sequence of characters from the input.  `WORD` skips any
		delimiters at the current input position, then reads characters until it finds
		the delimiter again.  It returns the address of a buffer with the length in the
		first byte, followed by the characters that made up the word.

		In a few places later in the C++ code, you will see the call sequence `bl();
		word(); count();`.  This corresponds to the Forth phrase `BL WORD COUNT`, which
		is how Forth code typically reads a space-delimited word from the input and
		get its address and length.

		The standards specify that the `WORD` buffer must contain a space character
		after the character data, but I'm not going to worry about this obsolescent
		requirement.

		****/
		
		void  skipSpacesInSource() {
				// Skip leading delimiters
				while(getSourceBufferRemain() > 0) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					if (std::isspace(static_cast<unsigned char>(currentChar))) {
						incSourceBufferOffset();
					} else {
						return;
					}
				}
		}
		// WORD ( char "<chars>ccc<char>" -- c-addr )
		void  word() {
			REQUIRE_DSTACK_DEPTH(1, "WORD");
			auto delim = static_cast<char>(dStack.getTop());
			/****

			I need a buffer to store the result of the Forth `WORD` word.  As with the
			input buffer, I use a `std::string` so I don't need to worry about memory
			management.

			Note that while this is a `std::string`, its format is not a typical strings.
			The buffer returned by `WORD` has the word length as its first character.
			That is, it is a Forth _counted string_.

			****/

			std::string wordBuffer{};
			wordBuffer.push_back(0);  // First char of buffer is length.
			// Skip leading delimiters
			if (getSourceBufferRemain() > 0) {
				auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				while (getSourceBufferRemain() > 0 && ((currentChar == delim)
					|| (delim == ' ' && isspace(static_cast<unsigned char>(currentChar)))
					)) {
					incSourceBufferOffset();
					currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				}
			}
			if (getSourceBufferRemain() > 0) {
				// Copy characters until we see the delimiter again.
				while (getSourceBufferRemain() >0 ) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());	
					if( currentChar != delim
					&& !(delim == ' ' && (isspace(static_cast<unsigned char>(currentChar))))
					) {
					wordBuffer.push_back(static_cast<unsigned char>(currentChar));
					incSourceBufferOffset();
					} else {
						break;
					}
				}
				// source point to the delimiter char, skip it.
				if (getSourceBufferRemain() >0 ) {
					incSourceBufferOffset(); 
				}
			}
			if (wordBuffer.size() > 255){
				// @bug it is catched below
				throwMessage(std::string("WORD: very long word "), errorParsedStringOverflow); return;
			}
			// Update the count at the beginning of the buffer.
				wordBuffer[0] = static_cast<char>(wordBuffer.size() - 1);
				// copy to fixed buffer
				moveIntoDataSpace(VarOffsetWordBuffer, wordBuffer.c_str(), wordBuffer.size());
				dStack.setTop(CELL(VarOffsetWordBuffer));

		}
		Xt blWordFind(std::string &wordBuffer) {

			auto delim = ' ';
			/****

			I need a buffer to store the result of the Forth `WORD` word.  As with the
			input buffer, I use a `std::string` so I don't need to worry about memory
			management.

			Note that while this is a `std::string`, its format is not a typical strings.
			The buffer returned by `WORD` has the word length as its first character.
			That is, it is a Forth _counted string_.

			****/
			wordBuffer.resize(0);  // First char of buffer is length.
			
			// Skip leading delimiters
			if (getSourceBufferRemain() > 0) {
				auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				while (getSourceBufferRemain() > 0 && ((currentChar == delim)
					|| (delim == ' ' && isspace(static_cast<unsigned char>(currentChar)))
					)) {
					incSourceBufferOffset();
					currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				}
			}
			if (getSourceBufferRemain() > 0) {
				// Copy characters until we see the delimiter again.
				while (getSourceBufferRemain() >0 ) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());	
					if( currentChar != delim
					&& !(delim == ' ' && (isspace(static_cast<unsigned char>(currentChar))))
					) {
					wordBuffer.push_back(static_cast<unsigned char>(currentChar));
					incSourceBufferOffset();
					} else {
						break;
					}
				}
				// source point to the delimiter char, skip it.
				if (getSourceBufferRemain() >0 ) {
					incSourceBufferOffset(); 
				}
			}
			if (wordBuffer.size() > 255){
				// @bug it is catched below
				throwMessage(std::string("WORD: very long word "), errorParsedStringOverflow);
				return 0;
			}
			if(localVariables.size()>0){
				std::string localName{wordBuffer};
				for(auto &c: localName) c=toupper_ascii(c);
				for(auto it=localVariables.begin(),itEnd=localVariables.end();it!=itEnd;++it){
					if((*it).localName==localName){
						// compale address of local variable
						// and retrun XT of FETCH @
						data(doLiteralXt);
						data(std::distance(localVariables.begin(),it));
						return pickReturnStackXt ;
					}
				}		
			}
			auto word = findDefinition(wordBuffer);
			return word;
			
		}
		// UPPERWORD ( char "<chars>ccc<char>" -- c-addr )
		void  upperword() {
			REQUIRE_DSTACK_DEPTH(1, "UPPERWORD");
			auto delim = static_cast<char>(dStack.getTop());
			/****

			I need a buffer to store the result of the Forth `WORD` word.  As with the
			input buffer, I use a `std::string` so I don't need to worry about memory
			management.

			Note that while this is a `std::string`, its format is not a typical strings.
			The buffer returned by `WORD` has the word length as its first character.
			That is, it is a Forth _counted string_.

			****/

			std::string wordBuffer{};
			wordBuffer.push_back(0);  // First char of buffer is length.
			
				// Skip leading delimiters
				if (getSourceBufferRemain() > 0) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					while (getSourceBufferRemain() > 0 && ((currentChar == delim)
						|| (delim == ' ' && isspace(static_cast<unsigned char>(currentChar)))
						)) {
						incSourceBufferOffset();
						currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					}
				}
				if (getSourceBufferRemain() > 0) {
					// Copy characters until we see the delimiter again.
					while (getSourceBufferRemain() >0 ) {
						auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());	
						if( currentChar != delim
						&& !(delim == ' ' && (isspace(static_cast<unsigned char>(currentChar))))
						) {
						wordBuffer.push_back(toupper_ascii(static_cast<unsigned char>(currentChar)));
						incSourceBufferOffset();
						} else {
							break;
						}
					}
					// source point to the delimiter char, skip it.
					if (getSourceBufferRemain() >0 ) {
						incSourceBufferOffset(); 
					}
				}
				if (wordBuffer.size() > 255){
					// @bug it is catched below
					throwMessage(std::string("WORD: very long word "), errorParsedStringOverflow);
					return;
				}
				// Update the count at the beginning of the buffer.
				wordBuffer[0] = static_cast<char>(wordBuffer.size() - 1);
				// copy to fixed buffer
				moveIntoDataSpace(VarOffsetWordBuffer, wordBuffer.c_str(), wordBuffer.size());
				dStack.setTop(CELL(VarOffsetWordBuffer));
		}
		// FIND-XT-NAME ( addr -- addr u )
		void  findxtname() {
			REQUIRE_DSTACK_DEPTH(1, "FIND-XT-NAME");
			std::string wordBuffer(16,' ');
			auto address = dStack.getTop(); pop();
			auto xt=CELL(getDataCell(address));
			auto xtfound=findXt(xt);
			//std::cout << std::endl << address << " "<< xt << " " << xtfound << std::endl;
			if(xtfound>0){
				wordBuffer=definitionsAt(xtfound).name;	
				//std::cerr << " more " << wordBuffer;
			} 
			if(wordBuffer.size()<16) {
			 wordBuffer.append(std::string(16-wordBuffer.size(), ' '));
			}

#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << wordBuffer  ;
				break;
			case ToStdCout:
				std::cout << wordBuffer ;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}
		void  findcaller() {
			REQUIRE_DSTACK_DEPTH(1, "FIND-CALLER");
			std::string wordBuffer(16,' ');
			auto address = dStack.getTop(); pop();
			auto xtfound=findDoes(address);
			//std::cout << std::endl << address << " "<< xt << " " << xtfound << std::endl;
			if(xtfound>0){
				wordBuffer=definitionsAt(xtfound).name;	
			} 
			if(wordBuffer.size()<16) {
			 wordBuffer.append(std::string(16-wordBuffer.size(), ' '));
			}

#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << wordBuffer  ;
				break;
			case ToStdCout:
				std::cout << wordBuffer ;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}

		// Given a cell that might be an DOES member of the defined name, search for it in the definitions list.
		//
		// Returns a pointer to the definition if found, or 0 if not.
		Xt findDoes(Cell x) {
			for (auto i = definitions.rbegin() , iend=definitions.rend(); i != iend ; ++i) {
				auto& defn = *i;
				if ((defn.does) == static_cast<Xt>(x))
					return defn.numberInVector; 
			}
			return 0;
		}


		/****

		`PARSE` is similar to `WORD`, but does not skip leading delimiters and provides
		an address-length result.

		****/

		// PARSE ( char "ccc<char>" -- c-addr u )
		void parse() {
			REQUIRE_DSTACK_DEPTH(1, "PARSE");
			REQUIRE_DSTACK_AVAILABLE(1, "PARSE");

			auto delim = static_cast<char>(dStack.getTop());
			/****

			I need a buffer to store the result of the Forth `PARSE` word.  Unlike `WORD`,
			this is a "normal" string and I won't need to store the count at the beginning
			of this buffer.

			****/

			std::string parseBuffer{};
			parseBuffer.clear();
			// Copy characters until we see the delimiter.

			bool exits{ false };
			while (!exits){
				while (getSourceBufferRemain()==0){ 
					// load next string from input buffer
					if (delim == ')') {
						auto flag=refillNextLine();
						if (!flag) {
							exits = true;							
						}
					}
					else {
						exits = true;
						break;
					}
				}
				if (getSourceBufferRemain() > 0) {
					// next char
					auto ch = getDataChar(getSourceAddress() + getSourceBufferOffset());
					incSourceBufferOffset();
					if ((delim == ' ' && isspace(static_cast<unsigned char>(ch))) || (delim == ch)) {
						exits = true;
					}
					else {
						parseBuffer.push_back(ch);
					}
				}
			}
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(parseBuffer);

			dStack.setTop(CELL(dataInDataSpace_));
			push(static_cast<Cell>(parseBuffer.size()));
		}
		/****

		Multiline comment

		****/

		// ( ( "ccc<paren>" -- )
		void multilinecomment() {
			auto delim = ')';
			std::string parseBuffer{};
			// Copy characters until we see the delimiter.
			bool exits{ false };
			while (!exits) {
				while (getSourceBufferRemain() == 0) {
					// load next string from input buffer
					auto flag = refillNextLine();
					if (!flag) {
						throwMessage(std::string("PARSE: Did not find expected delimiter \'" +
							std::string(1, delim) + "\'")
							, errorParsedStringOverflow);
						return;	
					}
				}
				if (getSourceBufferRemain() > 0) {
					// next char
					auto ch = getDataChar(getSourceAddress() + getSourceBufferOffset());
					incSourceBufferOffset();
					if ((delim == ' ' && isspace(static_cast<unsigned char>(ch))) || (delim == ch)) {
						exits = true;
					}
					else {
						parseBuffer.push_back(ch);
					}
				}
			}
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(parseBuffer);
			dStack.setTop(CELL(dataInDataSpace_));
			push(static_cast<Cell>(parseBuffer.size()));
		}

		/****

		`BL` puts a space character on the stack.  It is often seen in the phrase `BL
		WORD` to parse a space-delimited word, and will be seen later in the Forth
		definition of `SPACE`.

		****/
		// BL ( -- char )
		void bl() {
			REQUIRE_DSTACK_AVAILABLE(1, "BL");
			push(' ');
		}

		/****

		Next I define arithmetic primitives.

		Note that I need to use the `SCell` type for signed operations, and the `Cell`
		type for unsigned operations.

		****/

		// + ( n1 n2 -- n3 )
		void plus() {
			REQUIRE_DSTACK_DEPTH(2, "+");
			auto n2 = static_cast<SCell>(dStack.getTop()); pop();
			auto n1 = static_cast<SCell>(dStack.getTop());
			dStack.setTop(static_cast<Cell>(n1 + n2));
		}

		// - ( n1 n2 -- n3 )
		void minus() {
			REQUIRE_DSTACK_DEPTH(2, "-");
			auto n2 = static_cast<SCell>(dStack.getTop()); pop();
			auto n1 = static_cast<SCell>(dStack.getTop());
			dStack.setTop(static_cast<Cell>(n1 - n2));
		}

		// * ( n1 n2 -- n3 )
		void star() {
			REQUIRE_DSTACK_DEPTH(2, "*");
			auto n2 = static_cast<SCell>(dStack.getTop()); pop();
			auto n1 = static_cast<SCell>(dStack.getTop());
			dStack.setTop(static_cast<Cell>(n1 * n2));
		}

		// / ( n1 n2 -- n3 )
		void slash() {
			REQUIRE_DSTACK_DEPTH(2, "/");
			auto n2 = static_cast<SCell>(dStack.getTop()); pop();
			auto n1 = static_cast<SCell>(dStack.getTop());
			RUNTIME_ERROR_IF(n2 == 0, "/: zero divisor",errorDivisionByZero);
			dStack.setTop(static_cast<Cell>(n1 / n2));
		}

		// /MOD ( n1 n2 -- n3 n4 )
		void slashMod() {
			REQUIRE_DSTACK_DEPTH(2, "/MOD");
			auto n2 = static_cast<SCell>(dStack.getTop());
			auto n1 = static_cast<SCell>(dStack.getTop(1));
			RUNTIME_ERROR_IF(n2 == 0, "/MOD: zero divisor", errorDivisionByZero);
			auto result = std::ldiv(n1, n2);
			dStack.setTop(1, static_cast<Cell>(result.rem));
			dStack.setTop(static_cast<Cell>(result.quot));
		}
#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
		typedef double FCell;
		const int FCellSize = sizeof(FCell);
		ForthStack<FCell> fStack{};
#define REQUIRE_FSTACK_DEPTH(n, name)        requireFStackDepth(n, name)
#define REQUIRE_FSTACK_AVAILABLE(n, name)    requireFStackAvailable(n, name)
		void requireFStackDepth(std::size_t n, const char* name) {
			RUNTIME_ERROR_IF(fStack.stackDepth() < static_cast<size_t>(n),
				std::string(name) + ": float stack underflow", errorStackUnderflow);
		}

		void requireFStackAvailable(std::size_t n, const char* name) {
			RUNTIME_ERROR_IF(!fStack.availableStack(n),
				std::string(name) + ": float stack overflow", errorStackOverflow);
		}
		void setDataCell(AAddr pointer, const FCell &value){
			for (Cell i = 0; i < sizeof(FCell); ++i){
				dataSpaceSet(pointer + i,  static_cast<const unsigned char*>(static_cast<const void*>(&value))[i]);
			}
		}
		void setDataCell32(AAddr pointer, const FCell &value) {
			float value1{ static_cast<float>(value) };
			for (Cell i = 0; i < sizeof(value1); ++i) {
				dataSpaceSet(pointer + i, static_cast<const unsigned char*>(static_cast<const void*>(&value1))[i]);
			}
		}
		void setDataCell64(AAddr pointer, const FCell  &value) {
			double value1 = value;
			for (Cell i = 0; i < sizeof(value1); ++i) {
				dataSpaceSet(pointer + i, static_cast<const unsigned char*>(static_cast<const void*>(&value1))[i]);
			}
		}

		FCell getDataFCell(CAddr pointer) {
			FCell value1{ 0 };
			for (Cell i = 0; i < sizeof(value1); ++i) {
				static_cast<unsigned char*>(static_cast<void*>(&value1))[i] = dataSpaceAt(pointer + i);
			}
			return value1;
		}

FCell getDataFCell32(CAddr pointer){
			float value1{ 0 };
			for (Cell i = 0; i < sizeof(value1); ++i){
				static_cast<unsigned char*>(static_cast<void*>(&value1))[i] = dataSpaceAt(pointer + i);
			}
			return value1;
		}


		FCell getDataFCell64(CAddr pointer) {
			double value1{ 0 };
			for (Cell i = 0; i < sizeof(value1); ++i) {
				static_cast<unsigned char*>(static_cast<void*>(&value1))[i] = dataSpaceAt(pointer + i);
			}
			return value1;
		}


		// + ( n1 n2 -- n3 )
		void f_plus() {
			REQUIRE_FSTACK_DEPTH(2, "F+");
			auto n2 = static_cast<FCell>(fStack.getTop()); fStack.pop();
			auto n1 = static_cast<FCell>(fStack.getTop());
			fStack.setTop(static_cast<FCell>(n1 + n2));
		}

		// - ( n1 n2 -- n3 )
		void f_minus() {
			REQUIRE_FSTACK_DEPTH(2, "F-");
			auto n2 = static_cast<FCell>(fStack.getTop()); fStack.pop();
			auto n1 = static_cast<FCell>(fStack.getTop());
			fStack.setTop(static_cast<FCell>(n1 - n2));
		}

		// * ( n1 n2 -- n3 )
		void f_star() {
			REQUIRE_FSTACK_DEPTH(2, "F*");
			auto n2 = static_cast<FCell>(fStack.getTop()); fStack.pop();
			auto n1 = static_cast<FCell>(fStack.getTop());
			fStack.setTop(static_cast<FCell>(n1 * n2));
		}

		// / ( n1 n2 -- n3 )
		void f_slash() {
			REQUIRE_FSTACK_DEPTH(2, "F/");
			auto n2 = static_cast<FCell>(fStack.getTop()); fStack.pop();
			auto n1 = static_cast<FCell>(fStack.getTop());
			// division by 0 must return actual Nan +Inf or -Inf
			// RUNTIME_ERROR_IF(n2 == 0., "/: zero divisor", errorDivisionByZero);
			fStack.setTop(static_cast<FCell>(n1 / n2));
		}
		// F0= ( -- flag ) ( F: r -- ) or ( r -- flag )
		void f_equals0() {
			REQUIRE_DSTACK_AVAILABLE(1, "F0=");
			REQUIRE_FSTACK_DEPTH(1, "F0=");
			auto n2 = fStack.getTop(); fStack.pop();
			dStack.push(0.0 == n2 ? True : False);
		}
		// F0< ( -- flag ) ( F: r -- ) or ( r -- flag )
		void f_less0() {
			REQUIRE_DSTACK_AVAILABLE(1, "F0<");
			REQUIRE_FSTACK_DEPTH(1, "F0<");
			auto n2 = fStack.getTop(); fStack.pop();
			dStack.push(0.0 > n2 ? True : False);
		}
		// F< ( -- flag ) ( F: r1 r2 -- ) or ( r1 r2 -- flag )
		void f_less() {
			REQUIRE_DSTACK_AVAILABLE(1, "F<");
			REQUIRE_FSTACK_DEPTH(2, "F<");
			auto r2 = fStack.getTop(); fStack.pop();
			auto r1 = fStack.getTop(); fStack.pop();
			dStack.push(r1 < r2 ? True : False);
		}
		// F! ( f-addr -- ) ( F: r -- ) or ( r f-addr -- )
		void f_store() {
			REQUIRE_DSTACK_DEPTH(1, "F!");
			REQUIRE_FSTACK_DEPTH(1, "F!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "F!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell(aaddr, x);
		}

		// F@ ( f-addr -- ) ( F: -- r ) or ( f-addr -- r )
		void f_fetch() {
			REQUIRE_DSTACK_DEPTH(1, "F@");
			REQUIRE_FSTACK_AVAILABLE(1, "D@");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "F@");
			fStack.push(getDataFCell(aaddr));
		}

		// D>F ( d -- ) ( F: -- r ) or ( d -- r )
		void f_dtof(){
			REQUIRE_DSTACK_DEPTH(2, "D>F");
			REQUIRE_FSTACK_AVAILABLE(1, "D>F");
			DCell d1(dStack.getTop(1), dStack.getTop()); dStack.pop(); dStack.pop();
			fStack.push(static_cast<FCell>(d1.data_.SDcells));
		}
		// F>D ( -- d ) ( F: r -- ) or ( r -- d )
		void f_ftod(){
			REQUIRE_FSTACK_DEPTH(1, "F>D");
			REQUIRE_DSTACK_AVAILABLE(2, "F>D");
			auto n2 = fStack.getTop(); fStack.pop();
			DCell d1(n2);
			dStack.push(d1.data_.Cells.lo);
			dStack.push(d1.data_.Cells.hi);
		}

		// FALIGN ( -- )
		void f_align() {
			alignDataPointer();
			REQUIRE_VALID_HERE("FALIGN");
		}

		// FALIGNED ( addr -- a-addr )
		void f_aligned() {
			REQUIRE_DSTACK_DEPTH(1, "FALIGNED");
			dStack.setTop(CELL(alignAddress(dStack.getTop())));
		}

		void f_floats() {
			REQUIRE_DSTACK_DEPTH(1, "FLOATS");
			dStack.setTop(static_cast<SCell>(dStack.getTop())*FCellSize);
		}
		// FLOAT+ ( f-addr1 -- f-addr2 )
		void f_floatplus() {
			REQUIRE_DSTACK_DEPTH(1, "FLOAT+");
			auto n1 = dStack.getTop(); 
			dStack.setTop(n1+sizeof(FCell));
		}

		// DEPTH ( -- +n )
		void f_depth() {
			REQUIRE_DSTACK_AVAILABLE(1, "FDEPTH");
			push(static_cast<Cell>(fStack.stackDepth()));
		}

		// DROP ( x -- )
		void f_drop() {
			REQUIRE_FSTACK_DEPTH(1, "FDROP");
			fStack.pop();
		}

		// DUP ( x  -- x x )
		void f_dup() {
			REQUIRE_FSTACK_DEPTH(1, "FDUP");
			REQUIRE_FSTACK_AVAILABLE(1, "FDUP");
			fStack.push(fStack.getTop(0));
		}

		// FPICK ( xu ... x1 x0 u -- xu ... x1 x0 xu )
		void f_pick() {
			REQUIRE_DSTACK_DEPTH(1, "FPICK");
			auto index = dStack.getTop(); pop();
			REQUIRE_FSTACK_DEPTH(index + 1, "FPICK");
			fStack.push(fStack.getTop(index));
		}

		// FROLL ( xu xu-1 ... x0 u -- xu-1 ... x0 xu )
		void f_roll() {
			REQUIRE_DSTACK_DEPTH(1, "FROLL");
			auto n = dStack.getTop(); pop();
			if (n > 0) {
				REQUIRE_FSTACK_DEPTH(n + 1, "FROLL");
				auto x = fStack.getTop(n);
				fStack.moveStack(n, n - 1, n);
				fStack.setTop(x);
			}
		}
		// frot ( X Y Z -- Y Z X  )
		void f_rot() {
			REQUIRE_FSTACK_DEPTH(3, "FROT");
			auto n = 2;
			if (n > 0) {
				auto x = fStack.getTop(n);
				fStack.moveStack(n, n - 1, n);
				fStack.setTop(x);
			}
		}
		// fswap ( X Y  -- Y  X  )
		void f_swap() {
			REQUIRE_FSTACK_DEPTH(2, "SWAP");
			auto n = 1;
			if (n > 0) {
				auto x = fStack.getTop(n);
				fStack.moveStack(n, n - 1, n);
				fStack.setTop(x);
			}
		}

		// FLOOR ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_floor() {
			REQUIRE_FSTACK_DEPTH(1, "FLOOR");
			auto r1 = fStack.getTop(0);
			r1 = std::floor(r1);
			fStack.setTop(r1);
		}
		// FTRUNK ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_ftrunc() {
			REQUIRE_FSTACK_DEPTH(1, "FTRUNC");
			auto r1 = fStack.getTop(0);
			if (r1 > 0.0){
				r1 = std::floor(r1);
			}
			else {
				r1 = std::ceil(r1);
			}
			fStack.setTop(r1);
		}
		// FROUND ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_fround() {
			REQUIRE_FSTACK_DEPTH(1, "FROUND");
			auto r1 = fStack.getTop(0);
			r1 = std::round(r1);
			fStack.setTop(r1);
		}
		// FMAX ( F: r1 r2 -- r3 ) 
		void f_fmax() {
			REQUIRE_FSTACK_DEPTH(2, "FMAX");
			auto r1 = fStack.getTop(0); fStack.pop();
			auto r2 = fStack.getTop(0);
			if (r1 > r2){
				fStack.setTop(r1);
			}
		}
		// FMIN ( F: r1 r2 -- r3 ) 
		void f_fmin() {
			REQUIRE_FSTACK_DEPTH(2, "FMIN");
			auto r1 = fStack.getTop(0); fStack.pop();
			auto r2 = fStack.getTop(0);
			if (r1 < r2){
				fStack.setTop(r1);
			}
		}
		// FNEGATE ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_fnegate() {
			REQUIRE_FSTACK_DEPTH(1, "FNEGATE");
			auto r1 = fStack.getTop(0);
			fStack.setTop(-r1);
		}
		// (flit) ( -- x )
		//
		// Not a standard word.
		//
		// This instruction gets the value of the next cell, puts that on the float
		// stack, and then moves the instruction pointer to the next instruction.  It
		// is used by `FLITERAL` and other Forth words that need to specify a cell value
		// to put on the stack during execution.
		void doFLiteral() {
			REQUIRE_FSTACK_AVAILABLE(1, "(FLIT)");
			fStack.push(getDataFCell(next_command));
			next_command += sizeof(FCell);
		}
		// Store a cell to data space.
		void dataFloat(FCell x) {
			REQUIRE_VALID_HERE("F,");
			REQUIRE_DATASPACE_AVAILABLE(FCellSize, "F,");
			REQUIRE_ALIGNED(getDataPointer(), "F,");
			setDataCell((AADDR(getDataPointer())), x);
			incDataPointer(FCellSize);
		}

		void toFloat(){
			REQUIRE_DSTACK_AVAILABLE(1, ">FLOAT");
			REQUIRE_DSTACK_DEPTH(2, ">FLOAT");
			REQUIRE_FSTACK_AVAILABLE(1, ">FLOAT");
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop());
			std::string currentWord{};
			moveFromDataSpace(currentWord, caddr, length);
			static std::regex regexFloat{ "^[-+]?(([0-9]*[\\.]{0,1}[0-9]+)|([0-9]+[\\.]{0,1}[0-9]*))(([eEdD][-+]?)[0-9]*)?$" };
			std::smatch m1{};
			bool found = regex_search(currentWord, m1, regexFloat);
			if (found){
				FCell number = std::stod(currentWord);
				dStack.setTop(True);
				fStack.push(number);
				return;
			}
			// version for float numbers like 1+1 35.+2 etc (without E)
			static std::regex regexFloat2{ "^([-+]?)(([0-9]*[\\.]{0,1}[0-9]+)|([0-9]+[\\.]{0,1}[0-9]*))([-+][0-9]+)?$" };
			found = regex_search(currentWord, m1, regexFloat2);
			if (found){
				std::string currentWord2{};
				currentWord2.append( m1[1] ).append( m1[2] ).append("E").append(m1[5]);
				FCell number = std::stod(currentWord2);
				dStack.setTop(True);
				fStack.push(number);
				return;
			}
			static std::regex regexSpace{ "^[ ]*$" }; // special case - empty string is zero
			found = regex_search(currentWord, m1, regexSpace);
			if (found){
				FCell number{};
				dStack.setTop(True);
				fStack.push(number);
				return;
			}
			dStack.setTop(False);
		}
		/// @brief REPRESENT ( c-addr u -- n flag1 flag2 ) ( F: r -- ) 

		void represent(){
			REQUIRE_DSTACK_AVAILABLE(1, "REPRESENT");
			REQUIRE_DSTACK_DEPTH(2, "REPRESENT");
			REQUIRE_FSTACK_DEPTH(1, "REPRESENT");
			auto number=fStack.getTop();fStack.pop();
			auto length=dStack.getTop();
			auto address = (dStack.getTop(1)); 
			auto Sign=False;
			if(number<0.0){
				Sign=True;
				number=-number;
			}
if(length>31) length=31;
int newLog{};
char buffer[32];
if(number!=0.0){
 double loga=std::log10(number);
 int logaint=static_cast<int>(floor(loga));
 int newlogDiv=logaint-(length-1);
 newLog=logaint+1; 
 double new_a=number/pow(10,newlogDiv);
 auto new_a_round=std::llround(new_a);
 sprintf(buffer,"%lld",new_a_round);
} else {
  std::memset(buffer,'0',length);
  buffer[length]=0;
}
moveIntoDataSpace(address,buffer,std::strlen(buffer));
			if (1){
				dStack.setTop(1,newLog);
				dStack.setTop(Sign);
				dStack.push(True);
			}
		}

		// F~ ( -- flag ) ( F: r1 r2 r3 -- ) 
		void f_ftilda(){
			REQUIRE_DSTACK_AVAILABLE(3, "F~");
			REQUIRE_FSTACK_DEPTH(3, "F~");
			auto r3 = fStack.getTop(0); fStack.pop();
			auto r2 = fStack.getTop(0); fStack.pop();
			auto r1 = fStack.getTop(0); fStack.pop();
			Cell ret = False;
			if (r3 > 0.0){
				if (fabs(r2 - r1) < r3) ret = True;
			}
			else if ((r3 == 0.0) || (r3 == -0.0)){
				if (memcmp(&r1, &r2,sizeof(r1))==0) 
					ret = True;
			} if (r3 < 0.0){
				if (abs(r1 - r2) < (abs(r3)*(abs(r1) + abs(r2)))) ret = True;
			}
			dStack.push(ret);
		}
#endif
#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT_EXT
		/// F>S ( -- n ) ( F: r -- ) or ( r -- n )
		/// n is the single-cell signed-integer equivalent of the integer portion of r. 
		/// The fractional portion of r is discarded. An ambiguous condition exists if the integer 
		/// portion of r cannot be represented as a single-cell signed integer.
		void f_fmores() {
			REQUIRE_FSTACK_DEPTH(1, "F>S");
			REQUIRE_DSTACK_AVAILABLE(1, "F>S");
			auto r1 = fStack.getTop(0);fStack.pop();
			dStack.push(SCell(r1));
		}
		/// S>F ( n -- ) ( F: -- r ) or ( n -- r ) r is the floating-point equivalent of the single-cell value n. 
		/// An ambiguous condition exists if n can not be precisely represented as a floating-point value.
		void f_smoref() {
			REQUIRE_DSTACK_DEPTH(1, "S>F");
			REQUIRE_FSTACK_AVAILABLE(1, "S>F");
			auto r1 = dStack.getTop(0);dStack.pop();
			fStack.push(FCell(r1));
		}

		// F ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_fabs() {
			REQUIRE_FSTACK_DEPTH(1, "FABS");
			auto r1 = fStack.getTop(0);
			fStack.setTop(fabs(r1));
		}
		void f_fsin() {
			REQUIRE_FSTACK_DEPTH(1, "FSIN");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::sin(r1));
		}
		void f_fcos() {
			REQUIRE_FSTACK_DEPTH(1, "FCOS");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::cos(r1));
		}
		void f_fsincos() {
			REQUIRE_FSTACK_DEPTH(1, "FSINCOS");
			REQUIRE_DSTACK_AVAILABLE(1, "FSINCOS");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::sin(r1));
			fStack.push(std::cos(r1));
		}
		void f_ftan() {
			REQUIRE_FSTACK_DEPTH(1, "FTAN");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::tan(r1));
		}
		void f_fasin() {
			REQUIRE_FSTACK_DEPTH(1, "FASIN");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::asin(r1));
		}
		void f_facos() {
			REQUIRE_FSTACK_DEPTH(1, "FACOS");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::acos(r1));
		}
		void f_fatan() {
			REQUIRE_FSTACK_DEPTH(1, "FATAN");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::atan(r1));
		}
		// ( F: r1 r2 -- r3 ) or ( r1 r2 -- r3 ) r1/r2
		void f_fatan2() {
			REQUIRE_FSTACK_DEPTH(1, "FATAN2");
			auto r2 = fStack.getTop(0); fStack.pop();
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::atan2(r1,r2));
		}
		// FSQRT ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_fsqrt() {
			REQUIRE_FSTACK_DEPTH(1, "F");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::sqrt(r1));
		}
		// FEXP ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_fexp() {
			REQUIRE_FSTACK_DEPTH(1, "FEXP");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::exp(r1));
		}
		// FEXPM1 ( F: r1 -- r2 ) or ( r1 -- r2 ) exp(x)-1.0
		void f_fexpm1() {
			REQUIRE_FSTACK_DEPTH(1, "FEXPM1");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::expm1(r1));
		}
		// FLN ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_fln() {
			REQUIRE_FSTACK_DEPTH(1, "FLN");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::log(r1));
		}
		// FLOG ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_flog() {
			REQUIRE_FSTACK_DEPTH(1, "FLOG");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::log10(r1));
		}
		// FLNP1 ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_flnp1() {
			REQUIRE_FSTACK_DEPTH(1, "FLNP1");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::log1p(r1));
		}
		// F** ( F: r1 r2 -- r3 ) or ( r1 -- r2 )
		void f_fpower() {
			REQUIRE_FSTACK_DEPTH(2, "F**");
			auto r2 = fStack.getTop(0); fStack.pop();
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::pow(r1,r2));
		}		
		// FALOG ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_falog() {
			REQUIRE_FSTACK_DEPTH(1, "FALOG");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::pow(10.0,r1));
		}		
		// FSINH ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_fsinh() {
			REQUIRE_FSTACK_DEPTH(1, "FSINH");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::sinh(r1));
		}		
		// FCOSH ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_fcosh() {
			REQUIRE_FSTACK_DEPTH(1, "FCOSH");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::cosh(r1));
		}
		// FTANH ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_ftanh() {
			REQUIRE_FSTACK_DEPTH(1, "FTANH");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::tanh(r1));
		}		
		// FASINH ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_fasinh() {
			REQUIRE_FSTACK_DEPTH(1, "FASINH");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::asinh(r1));
		}		
		// FACOSH ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_facosh() {
			REQUIRE_FSTACK_DEPTH(1, "FACOSH");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::acosh(r1));
		}		
		// FATANH ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_fatanh() {
			REQUIRE_FSTACK_DEPTH(1, "FATANH");
			auto r1 = fStack.getTop(0);
			fStack.setTop(std::atanh(r1));
		}		
		// F ( F: r1 -- r2 ) or ( r1 -- r2 )
		void f_f() {
			REQUIRE_FSTACK_DEPTH(1, "F");
			auto r1 = fStack.getTop(0);
			fStack.setTop(r1);
		}
		unsigned precision_{};
		// PRECISION (   -- u ) 
		void f_precision() {
			REQUIRE_DSTACK_AVAILABLE(1, "PRECISION");
			auto u1 = precision_;
			dStack.push(u1);
		}
		// SET-PRECISION ( u --  ) 
		void f_setprecision() {
			REQUIRE_DSTACK_DEPTH(1, "SET-PRECISION");
			auto u1 = dStack.getTop(0); dStack.pop();
			precision_ = u1;
		}
		// F. ( n -- )
		void f_fdot() {
			REQUIRE_FSTACK_DEPTH(1, "F.");
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << std::fixed << std::setprecision(precision_) << static_cast<FCell>(fStack.getTop());
				break;
			case ToStdCout:
				std::cout << SETBASE() << std::fixed << std::setprecision(precision_) << static_cast<FCell>(fStack.getTop());
				std::cout.flush(); 
				break;
			default:
				break;
			}
#endif
			fStack.pop();
		}
		// FS. ( n -- )
		void f_fsdot() {
			REQUIRE_FSTACK_DEPTH(1, "FS.");
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << std::scientific << std::setprecision(precision_)
					<< static_cast<FCell>(fStack.getTop());
				break;
			case ToStdCout:
				std::cout << SETBASE() << std::scientific << std::setprecision(precision_)
					<< static_cast<FCell>(fStack.getTop());
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
			fStack.pop();
		}
		// FE. ( n -- )
		void f_fedot() {
			REQUIRE_FSTACK_DEPTH(1, "FE.");
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << std::scientific << std::setprecision(precision_) << static_cast<FCell>(fStack.getTop());
				break;
			case ToStdCout:
				std::cout << SETBASE() << std::scientific << std::setprecision(precision_) << static_cast<FCell>(fStack.getTop());
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
			fStack.pop();
		}

		/// SF! ( sf-addr -- ) ( F: r -- )
		void sf_store() {
			REQUIRE_DSTACK_DEPTH(1, "SF!");
			REQUIRE_FSTACK_DEPTH(1, "SF!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "SF!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell32(aaddr, x);
		}

		/// SF@ ( sf-addr -- ) ( F: -- r )
		void sf_fetch() {
			REQUIRE_DSTACK_DEPTH(1, "SF@");
			REQUIRE_FSTACK_AVAILABLE(1, "SF@");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "SF@");
			fStack.push(getDataFCell32(aaddr));
		}

		/// DF! ( df-addr -- ) ( F: r -- )
		void df_store() {
			REQUIRE_DSTACK_DEPTH(1, "DF!");
			REQUIRE_FSTACK_DEPTH(1, "DF!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "DF!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell64(aaddr, x);
		}

		/// DF@ ( df-addr -- ) ( F: -- r )
		void df_fetch() {
			REQUIRE_DSTACK_DEPTH(1, "DF@");
			REQUIRE_FSTACK_AVAILABLE(1, "DF@");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "DF@");
			fStack.push(getDataFCell64(aaddr));
		}

#endif
		// ENVIRONMENT? ( c-addr u -- false | i * x true )
		void environmentquestion(){
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop());
			std::string currentWord{};
			moveFromDataSpace(currentWord, caddr, length);
			Cell ret = False;
			if (currentWord.compare("/COUNTED-STRING") == 0){
				ret = 255;
			} else 
			if (currentWord.compare("/HOLD") == 0){
					ret = 255;
			}
				else
			if (currentWord.compare("ADDRESS-UNIT-BITS") == 0){
						ret = sizeof(Cell)*8;
					}
					else
						if (currentWord.compare("FLOORED") == 0){
							ret = False;
						}
						else
							if (currentWord.compare("RETURN-STACK-CELLS") == 0){
								ret = 100;
							}
							else
								if (currentWord.compare("STACK-CELLS") == 0){
									ret = 200;
								}
								else
									if (currentWord.compare("CORE") == 0){
										ret = True;
									}
									else
										if (currentWord.compare("EXCEPTION") == 0){
											ret = True;
										}
										else
											if (currentWord.compare("FLOATING") == 0){
												ret = True;
											} 
										else
											if (currentWord.compare("WORDLISTS") == 0){
												ret = 256;
											} 
										else
											if (currentWord.compare("#LOCALS") == 0){
												ret = 256;
											} 

#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
			else if (currentWord.compare("FLOATING-STACK") == 0){
				ret = 200;
			}else if (currentWord.compare("FLOATING") == 0){
				ret = 200;
			} else
			if (currentWord.compare("MAX-FLOAT") == 0){
				ret = True;
				fStack.push(std::numeric_limits<FCell>::max());
			}
#endif
			else {
				dStack.setTop(False);
				return;
			}
			dStack.setTop(ret);
			dStack.push(True);

		}
		/****

		Next, I define logical and relational primitives.

		****/

		// AND ( x1 x2 -- x3 )
		void bitwiseAnd() {
			REQUIRE_DSTACK_DEPTH(2, "AND");
			auto x2 = dStack.getTop(); pop();
			dStack.setTop(dStack.getTop() & x2);
		}